

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall gl4cts::AdvancedUsageManyCounters::Run(AdvancedUsageManyCounters *this)

{
  bool bVar1;
  GLuint GVar2;
  GLint GVar3;
  reference data_00;
  CallLogWrapper *pCVar4;
  int local_1a4;
  int local_1a0;
  int i_3;
  int i_2;
  GLuint data [64];
  int local_8c;
  GLenum local_88;
  int i_1;
  GLenum draw_buffers [8];
  int local_5c;
  int i;
  int s;
  allocator<unsigned_int> local_45;
  value_type_conflict4 local_44;
  undefined1 local_40 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> init_data;
  char *src_fs;
  char *src_vs;
  AdvancedUsageManyCounters *this_local;
  
  init_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_165a6d;
  GVar2 = gl4cts::anon_unknown_0::SACSubcaseBase::CreateProgram
                    (&this->super_SACSubcaseBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_vertex;\nvoid main() {\n  gl_Position = i_vertex;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,
                     "#version 420 core\nlayout(location = 0) out uvec4 o_color[8];\nuniform int u_active_counters[8];\nlayout(binding = 0) uniform atomic_uint ac_counter[8];\nvoid main() {\n  o_color[0] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[0]]));\n  o_color[1] = uvec4(atomicCounterDecrement(ac_counter[u_active_counters[1]]));\n  o_color[2] = uvec4(atomicCounter(ac_counter[u_active_counters[2]]));\n  o_color[3] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[3]]));\n  o_color[4] = uvec4(atomicCounterDecrement(ac_counter[u_active_counters[4]]));\n  o_color[5] = uvec4(atomicCounter(ac_counter[u_active_counters[5]]));\n  o_color[6] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[6]]));\n  o_color[7] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[7]]));\n}"
                     ,true);
  this->prog_ = GVar2;
  local_44 = 1000;
  std::allocator<unsigned_int>::allocator(&local_45);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,8,&local_44,&local_45);
  std::allocator<unsigned_int>::~allocator(&local_45);
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->counter_buffer_);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,this->counter_buffer_);
  data_00 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,0x20,data_00,0x88ea);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,0);
  glu::CallLogWrapper::glGenTextures
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,8,
             this->rt_);
  for (local_5c = 0; local_5c < 8; local_5c = local_5c + 1) {
    glu::CallLogWrapper::glBindTexture
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0xde1,this->rt_[local_5c]);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage2D
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0xde1,0,0x8236,8,8,0,0x8d94,0x1405,(void *)0x0);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0xde1,0);
  }
  glu::CallLogWrapper::glGenFramebuffers
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->fbo_);
  glu::CallLogWrapper::glBindFramebuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8d40,this->fbo_);
  for (local_8c = 0; local_8c < 8; local_8c = local_8c + 1) {
    glu::CallLogWrapper::glFramebufferTexture
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x8d40,local_8c + 0x8ce0,this->rt_[local_8c],0);
    (&local_88)[local_8c] = local_8c + 0x8ce0;
  }
  glu::CallLogWrapper::glDrawBuffers
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,8,
             &local_88);
  glu::CallLogWrapper::glBindFramebuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8d40,0);
  gl4cts::anon_unknown_0::SACSubcaseBase::CreateTriangle
            (&this->super_SACSubcaseBase,&this->vao_,&this->vbo_,(GLuint *)0x0);
  glu::CallLogWrapper::glUseProgram
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             this->prog_);
  pCVar4 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar4,this->prog_,"u_active_counters[0]");
  glu::CallLogWrapper::glUniform1i(pCVar4,GVar3,5);
  pCVar4 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar4,this->prog_,"u_active_counters[1]");
  glu::CallLogWrapper::glUniform1i(pCVar4,GVar3,2);
  pCVar4 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar4,this->prog_,"u_active_counters[2]");
  glu::CallLogWrapper::glUniform1i(pCVar4,GVar3,7);
  pCVar4 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar4,this->prog_,"u_active_counters[3]");
  glu::CallLogWrapper::glUniform1i(pCVar4,GVar3,3);
  pCVar4 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar4,this->prog_,"u_active_counters[4]");
  glu::CallLogWrapper::glUniform1i(pCVar4,GVar3,0);
  pCVar4 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar4,this->prog_,"u_active_counters[5]");
  glu::CallLogWrapper::glUniform1i(pCVar4,GVar3,4);
  pCVar4 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar4,this->prog_,"u_active_counters[6]");
  glu::CallLogWrapper::glUniform1i(pCVar4,GVar3,6);
  pCVar4 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  GVar3 = glu::CallLogWrapper::glGetUniformLocation(pCVar4,this->prog_,"u_active_counters[7]");
  glu::CallLogWrapper::glUniform1i(pCVar4,GVar3,1);
  glu::CallLogWrapper::glBindFramebuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8d40,this->fbo_);
  glu::CallLogWrapper::glViewport
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0,
             0,8,8);
  glu::CallLogWrapper::glBindBufferBase
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,0,this->counter_buffer_);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             this->vao_);
  glu::CallLogWrapper::glDrawArrays
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,4,
             0,3);
  glu::CallLogWrapper::glReadBuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8ce0);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0,
             0,8,8,0x8d94,0x1405,&i_2);
  bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                    (&this->super_SACSubcaseBase,0x40,(GLuint *)&i_2,1000);
  if (bVar1) {
    bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                      (&this->super_SACSubcaseBase,this->counter_buffer_,0x14,0x428);
    if (bVar1) {
      glu::CallLogWrapper::glReadBuffer
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8ce1);
      glu::CallLogWrapper::glReadPixels
                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,0,8,8,0x8d94,0x1405,&i_2);
      bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                        (&this->super_SACSubcaseBase,0x40,(GLuint *)&i_2,0x3a8);
      if (bVar1) {
        bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                          (&this->super_SACSubcaseBase,this->counter_buffer_,8,0x3a8);
        if (bVar1) {
          glu::CallLogWrapper::glReadBuffer
                    (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0x8ce2);
          glu::CallLogWrapper::glReadPixels
                    (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,0,0,8,8,0x8d94,0x1405,&i_2);
          for (local_1a0 = 0; local_1a0 < 0x40; local_1a0 = local_1a0 + 1) {
            if ((&i_2)[local_1a0] != 1000) {
              this_local = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
              goto LAB_00efddee;
            }
          }
          bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                            (&this->super_SACSubcaseBase,this->counter_buffer_,0x1c,1000);
          if (bVar1) {
            glu::CallLogWrapper::glReadBuffer
                      (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,0x8ce3);
            glu::CallLogWrapper::glReadPixels
                      (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,0,0,8,8,0x8d94,0x1405,&i_2);
            bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                              (&this->super_SACSubcaseBase,0x40,(GLuint *)&i_2,1000);
            if (bVar1) {
              bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                                (&this->super_SACSubcaseBase,this->counter_buffer_,0xc,0x428);
              if (bVar1) {
                glu::CallLogWrapper::glReadBuffer
                          (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                            super_CallLogWrapper,0x8ce4);
                glu::CallLogWrapper::glReadPixels
                          (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                            super_CallLogWrapper,0,0,8,8,0x8d94,0x1405,&i_2);
                bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                                  (&this->super_SACSubcaseBase,0x40,(GLuint *)&i_2,0x3a8);
                if (bVar1) {
                  bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                                    (&this->super_SACSubcaseBase,this->counter_buffer_,0,0x3a8);
                  if (bVar1) {
                    glu::CallLogWrapper::glReadBuffer
                              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                                super_CallLogWrapper,0x8ce5);
                    glu::CallLogWrapper::glReadPixels
                              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                                super_CallLogWrapper,0,0,8,8,0x8d94,0x1405,&i_2);
                    for (local_1a4 = 0; local_1a4 < 0x40; local_1a4 = local_1a4 + 1) {
                      if ((&i_2)[local_1a4] != 1000) {
                        this_local = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
                        goto LAB_00efddee;
                      }
                    }
                    bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                                      (&this->super_SACSubcaseBase,this->counter_buffer_,0x10,1000);
                    if (bVar1) {
                      glu::CallLogWrapper::glReadBuffer
                                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                                  super_CallLogWrapper,0x8ce6);
                      glu::CallLogWrapper::glReadPixels
                                (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                                  super_CallLogWrapper,0,0,8,8,0x8d94,0x1405,&i_2);
                      bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                                        (&this->super_SACSubcaseBase,0x40,(GLuint *)&i_2,1000);
                      if (bVar1) {
                        bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                                          (&this->super_SACSubcaseBase,this->counter_buffer_,0x18,
                                           0x428);
                        if (bVar1) {
                          glu::CallLogWrapper::glReadBuffer
                                    (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper
                                      .super_CallLogWrapper,0x8ce7);
                          glu::CallLogWrapper::glReadPixels
                                    (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper
                                      .super_CallLogWrapper,0,0,8,8,0x8d94,0x1405,&i_2);
                          bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckCounterValues
                                            (&this->super_SACSubcaseBase,0x40,(GLuint *)&i_2,1000);
                          if (bVar1) {
                            bVar1 = gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
                                              (&this->super_SACSubcaseBase,this->counter_buffer_,4,
                                               0x428);
                            if (bVar1) {
                              this_local = (AdvancedUsageManyCounters *)0x0;
                            }
                            else {
                              this_local = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
                            }
                          }
                          else {
                            this_local = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
                          }
                        }
                        else {
                          this_local = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
                        }
                      }
                      else {
                        this_local = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
                      }
                    }
                    else {
                      this_local = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
                    }
                  }
                  else {
                    this_local = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
                  }
                }
                else {
                  this_local = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
                }
              }
              else {
                this_local = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
              }
            }
            else {
              this_local = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
            }
          }
          else {
            this_local = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
          }
        }
        else {
          this_local = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (AdvancedUsageManyCounters *)&DAT_ffffffffffffffff;
  }
LAB_00efddee:
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		// create program
		const char* src_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_vertex;" NL "void main() {" NL
							 "  gl_Position = i_vertex;" NL "}";
		const char* src_fs =
			"#version 420 core" NL "layout(location = 0) out uvec4 o_color[8];" NL
			"uniform int u_active_counters[8];" NL "layout(binding = 0) uniform atomic_uint ac_counter[8];" NL
			"void main() {" NL "  o_color[0] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[0]]));" NL
			"  o_color[1] = uvec4(atomicCounterDecrement(ac_counter[u_active_counters[1]]));" NL
			"  o_color[2] = uvec4(atomicCounter(ac_counter[u_active_counters[2]]));" NL
			"  o_color[3] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[3]]));" NL
			"  o_color[4] = uvec4(atomicCounterDecrement(ac_counter[u_active_counters[4]]));" NL
			"  o_color[5] = uvec4(atomicCounter(ac_counter[u_active_counters[5]]));" NL
			"  o_color[6] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[6]]));" NL
			"  o_color[7] = uvec4(atomicCounterIncrement(ac_counter[u_active_counters[7]]));" NL "}";
		prog_ = CreateProgram(src_vs, NULL, NULL, NULL, src_fs, true);

		// create atomic counter buffer
		std::vector<GLuint> init_data(8, 1000);
		glGenBuffers(1, &counter_buffer_);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, counter_buffer_);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 32, &init_data[0], GL_DYNAMIC_COPY);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		// create render targets
		const int s = 8;
		glGenTextures(8, rt_);

		for (int i = 0; i < 8; ++i)
		{
			glBindTexture(GL_TEXTURE_2D, rt_[i]);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_R32UI, s, s, 0, GL_RED_INTEGER, GL_UNSIGNED_INT, NULL);
			glBindTexture(GL_TEXTURE_2D, 0);
		}

		// create fbo
		glGenFramebuffers(1, &fbo_);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo_);
		GLenum draw_buffers[8];
		for (int i = 0; i < 8; ++i)
		{
			glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + i, rt_[i], 0);
			draw_buffers[i] = GL_COLOR_ATTACHMENT0 + i;
		};
		glDrawBuffers(8, draw_buffers);
		glBindFramebuffer(GL_FRAMEBUFFER, 0);

		// create geometry
		CreateTriangle(&vao_, &vbo_, NULL);

		// set uniforms
		glUseProgram(prog_);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[0]"), 5);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[1]"), 2);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[2]"), 7);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[3]"), 3);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[4]"), 0);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[5]"), 4);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[6]"), 6);
		glUniform1i(glGetUniformLocation(prog_, "u_active_counters[7]"), 1);

		// draw
		glBindFramebuffer(GL_FRAMEBUFFER, fbo_);
		glViewport(0, 0, s, s);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, counter_buffer_);
		glBindVertexArray(vao_);
		glDrawArrays(GL_TRIANGLES, 0, 3);

		// validate
		GLuint data[s * s];
		glReadBuffer(GL_COLOR_ATTACHMENT0);
		glReadPixels(0, 0, s, s, GL_RED_INTEGER, GL_UNSIGNED_INT, data);
		if (!CheckCounterValues(s * s, data, 1000))
			return ERROR;
		if (!CheckFinalCounterValue(counter_buffer_, 20, 1064))
			return ERROR;

		glReadBuffer(GL_COLOR_ATTACHMENT1);
		glReadPixels(0, 0, s, s, GL_RED_INTEGER, GL_UNSIGNED_INT, data);
		if (!CheckCounterValues(s * s, data, 1000 - 64))
			return ERROR;
		if (!CheckFinalCounterValue(counter_buffer_, 8, 1000 - 64))
			return ERROR;

		glReadBuffer(GL_COLOR_ATTACHMENT2);
		glReadPixels(0, 0, s, s, GL_RED_INTEGER, GL_UNSIGNED_INT, data);
		for (int i = 0; i < s * s; ++i)
			if (data[i] != 1000)
				return ERROR;
		if (!CheckFinalCounterValue(counter_buffer_, 28, 1000))
			return ERROR;

		glReadBuffer(GL_COLOR_ATTACHMENT3);
		glReadPixels(0, 0, s, s, GL_RED_INTEGER, GL_UNSIGNED_INT, data);
		if (!CheckCounterValues(s * s, data, 1000))
			return ERROR;
		if (!CheckFinalCounterValue(counter_buffer_, 12, 1064))
			return ERROR;

		glReadBuffer(GL_COLOR_ATTACHMENT4);
		glReadPixels(0, 0, s, s, GL_RED_INTEGER, GL_UNSIGNED_INT, data);
		if (!CheckCounterValues(s * s, data, 1000 - 64))
			return ERROR;
		if (!CheckFinalCounterValue(counter_buffer_, 0, 1000 - 64))
			return ERROR;

		glReadBuffer(GL_COLOR_ATTACHMENT5);
		glReadPixels(0, 0, s, s, GL_RED_INTEGER, GL_UNSIGNED_INT, data);
		for (int i = 0; i < s * s; ++i)
			if (data[i] != 1000)
				return ERROR;
		if (!CheckFinalCounterValue(counter_buffer_, 16, 1000))
			return ERROR;

		glReadBuffer(GL_COLOR_ATTACHMENT6);
		glReadPixels(0, 0, s, s, GL_RED_INTEGER, GL_UNSIGNED_INT, data);
		if (!CheckCounterValues(s * s, data, 1000))
			return ERROR;
		if (!CheckFinalCounterValue(counter_buffer_, 24, 1064))
			return ERROR;

		glReadBuffer(GL_COLOR_ATTACHMENT7);
		glReadPixels(0, 0, s, s, GL_RED_INTEGER, GL_UNSIGNED_INT, data);
		if (!CheckCounterValues(s * s, data, 1000))
			return ERROR;
		if (!CheckFinalCounterValue(counter_buffer_, 4, 1064))
			return ERROR;

		return NO_ERROR;
	}